

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

char * google::protobuf::internal::anon_unknown_0::ParseTimezoneOffset(char *data,int64 *offset)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  
  if ((byte)(*data - 0x30U) < 10) {
    pcVar5 = data + 2;
    lVar4 = 0;
    uVar2 = 0;
    do {
      if (9 < (byte)(data[lVar4] - 0x30U)) {
        pcVar5 = data + lVar4;
        break;
      }
      uVar2 = ((uint)(byte)data[lVar4] + uVar2 * 10) - 0x30;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 2);
    pcVar1 = (char *)0x0;
    if (uVar2 < 0x18) {
      pcVar1 = pcVar5;
    }
    iVar3 = uVar2 * 0x3c;
  }
  else {
    iVar3 = 0;
    pcVar1 = (char *)0x0;
  }
  if (pcVar1 == (char *)0x0) {
    return (char *)0x0;
  }
  if (*pcVar1 == ':') {
    uVar2 = 0;
    if ((byte)(pcVar1[1] - 0x30U) < 10) {
      pcVar5 = pcVar1 + 3;
      lVar4 = 0;
      do {
        if (9 < (byte)(pcVar1[lVar4 + 1] - 0x30U)) {
          pcVar5 = pcVar1 + lVar4 + 1;
          break;
        }
        uVar2 = ((uint)(byte)pcVar1[lVar4 + 1] + uVar2 * 10) - 0x30;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 2);
      pcVar1 = (char *)0x0;
      if (uVar2 < 0x3c) {
        pcVar1 = pcVar5;
      }
    }
    else {
      pcVar1 = (char *)0x0;
    }
    if (pcVar1 != (char *)0x0) {
      *offset = (long)(int)((uVar2 + iVar3) * 0x3c);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParseInt(const char* data, int width, int min_value,
                     int max_value, int* result) {
  if (!ascii_isdigit(*data)) {
    return nullptr;
  }
  int value = 0;
  for (int i = 0; i < width; ++i, ++data) {
    if (ascii_isdigit(*data)) {
      value = value * 10 + (*data - '0');
    } else {
      break;
    }
  }
  if (value >= min_value && value <= max_value) {
    *result = value;
    return data;
  } else {
    return nullptr;
  }
}